

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::SPFForceManager::updateLongRangePotentials(SPFForceManager *this)

{
  RealType RVar1;
  RealType RVar2;
  double dVar3;
  potVec longRangePotentials;
  potVec local_108;
  potVec local_c8;
  potVec local_90;
  Vector<double,_7U> local_58;
  
  Snapshot::getLongRangePotentials(&local_90,this->temporarySourceSnapshot_);
  Snapshot::getLongRangePotentials(&local_c8,this->temporarySinkSnapshot_);
  linearCombination<OpenMD::Vector<double,7u>>(&local_58,this,&local_90,&local_c8);
  local_108.data_[6] = local_58.data_[6];
  local_108.data_[4] = local_58.data_[4];
  local_108.data_[5] = local_58.data_[5];
  local_108.data_[2] = local_58.data_[2];
  local_108.data_[3] = local_58.data_[3];
  local_108.data_[0] = local_58.data_[0];
  local_108.data_[1] = local_58.data_[1];
  Snapshot::setLongRangePotentials(this->currentSnapshot_,&local_108);
  RVar1 = Snapshot::getReciprocalPotential(this->temporarySourceSnapshot_);
  RVar2 = Snapshot::getReciprocalPotential(this->temporarySinkSnapshot_);
  dVar3 = linearCombination<double>(this,RVar1,RVar2);
  Snapshot::setReciprocalPotential(this->currentSnapshot_,dVar3);
  RVar1 = Snapshot::getSurfacePotential(this->temporarySourceSnapshot_);
  RVar2 = Snapshot::getSurfacePotential(this->temporarySinkSnapshot_);
  dVar3 = linearCombination<double>(this,RVar1,RVar2);
  Snapshot::setSurfacePotential(this->currentSnapshot_,dVar3);
  return;
}

Assistant:

void SPFForceManager::updateLongRangePotentials() {
    potVec longRangePotentials =
        linearCombination(temporarySourceSnapshot_->getLongRangePotentials(),
                          temporarySinkSnapshot_->getLongRangePotentials());
    currentSnapshot_->setLongRangePotentials(longRangePotentials);

    RealType reciprocalPotential =
        linearCombination(temporarySourceSnapshot_->getReciprocalPotential(),
                          temporarySinkSnapshot_->getReciprocalPotential());
    currentSnapshot_->setReciprocalPotential(reciprocalPotential);

    RealType surfacePotential =
        linearCombination(temporarySourceSnapshot_->getSurfacePotential(),
                          temporarySinkSnapshot_->getSurfacePotential());
    currentSnapshot_->setSurfacePotential(surfacePotential);
  }